

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<char>_>::
decrement(boundary_point_index_iterator<std::_List_iterator<char>_> *this)

{
  size_t sVar1;
  mapping_type *pmVar2;
  size_t sVar3;
  element_type *peVar4;
  long lVar5;
  pointer pbVar6;
  _List_node_base *p_Var7;
  long lVar8;
  pointer pbVar9;
  size_t sVar10;
  bool bVar11;
  
  sVar10 = this->current_;
  if (sVar10 == 0) {
    update_current(this,0);
    return;
  }
  lVar8 = sVar10 * 0x10 + -8;
  do {
    bVar11 = true;
    if ((sVar10 != 1) &&
       (peVar4 = (this->map_->index_).
                 super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,
       lVar5 = (long)(peVar4->
                     super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     )._M_impl.super__Vector_impl_data._M_start,
       sVar10 < (ulong)((long)(peVar4->
                              super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                              )._M_impl.super__Vector_impl_data._M_finish - lVar5 >> 4))) {
      bVar11 = (*(uint *)(lVar5 + lVar8) & this->mask_) != 0;
    }
    sVar1 = sVar10 - 1;
  } while ((sVar10 != 1) && (lVar8 = lVar8 + -0x10, sVar10 = sVar1, !bVar11));
  pmVar2 = this->map_;
  peVar4 = (pmVar2->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar8 = (long)(peVar4->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (peVar4->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar10 = (long)pbVar9 - lVar8 >> 4;
  pbVar9 = pbVar9 + -1;
  pbVar6 = (pointer)(lVar8 + sVar1 * 0x10);
  if (sVar10 == sVar1) {
    pbVar6 = pbVar9;
  }
  sVar3 = pbVar6->offset;
  p_Var7 = (this->value_).iterator_._M_node;
  pbVar6 = (pointer)(this->current_ * 0x10 + lVar8);
  if (sVar10 == this->current_) {
    pbVar6 = pbVar9;
  }
  sVar10 = pbVar6->offset;
  if (sVar3 == sVar10 || (long)(sVar3 - sVar10) < 0) {
    if (sVar3 != sVar10) {
      lVar8 = sVar10 - sVar3;
      do {
        p_Var7 = p_Var7->_M_prev;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  }
  else {
    lVar8 = sVar10 - sVar3;
    do {
      p_Var7 = p_Var7->_M_next;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
  }
  this->current_ = sVar1;
  (this->value_).iterator_._M_node = p_Var7;
  peVar4 = (pmVar2->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar8 = (long)(peVar4->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(peVar4->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish - lVar8 >> 4 != sVar1) {
    (this->value_).rule_ = *(rule_type *)(lVar8 + 8 + sVar1 * 0x10);
  }
  return;
}

Assistant:

void decrement()
                    {
                        size_t next = current_;
                        while(next>0) {
                            next--;
                            if(valid_offset(next))
                                break;
                        }
                        update_current(next);
                    }